

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveSelectStep(Walker *pWalker,Select *p)

{
  Parse *pParse;
  anon_union_8_11_9d6f43ba_for_u pOuterNC;
  sqlite3 *psVar1;
  Select *pSVar2;
  Select *pSVar3;
  anon_union_8_11_9d6f43ba_for_u aVar4;
  char *pcVar5;
  ExprList *pOrderBy;
  int iVar6;
  SrcList *pSVar7;
  int iVar8;
  Select *pSelect;
  long lVar9;
  char *pcVar10;
  long lVar11;
  ExprList_item *pEVar12;
  NameContext local_98;
  Walker local_60;
  
  iVar8 = 1;
  if ((p->selFlags & 4) == 0) {
    pParse = pWalker->pParse;
    pOuterNC = (anon_union_8_11_9d6f43ba_for_u)(pWalker->u).pNC;
    psVar1 = pParse->db;
    if ((p->selFlags & 0x40) == 0) {
      sqlite3SelectPrep(pParse,p,pOuterNC.pNC);
      iVar8 = 2;
      if (pParse->nErr == 0) {
        iVar8 = 2 - (uint)(psVar1->mallocFailed == '\0');
      }
    }
    else {
      pSVar2 = p->pPrior;
      iVar8 = 0;
      pSelect = p;
      do {
        *(byte *)&pSelect->selFlags = (byte)pSelect->selFlags | 4;
        local_98.nRef = 0;
        local_98.nErr = 0;
        local_98.ncFlags = 0;
        local_98._50_6_ = 0;
        local_98.pAggInfo = (AggInfo *)0x0;
        local_98.pNext = (NameContext *)0x0;
        local_98.pSrcList = (SrcList *)0x0;
        local_98.pEList = (ExprList *)0x0;
        local_98.pParse = pParse;
        iVar6 = sqlite3ResolveExprNames(&local_98,pSelect->pLimit);
        if ((iVar6 != 0) ||
           (iVar6 = sqlite3ResolveExprNames(&local_98,pSelect->pOffset), iVar6 != 0)) {
          return 2;
        }
        pSVar7 = pSelect->pSrc;
        if ((pSelect->selFlags & 0x10000) != 0) {
          (pSVar7->a[0].pSelect)->pOrderBy = pSelect->pOrderBy;
          pSelect->pOrderBy = (ExprList *)0x0;
        }
        iVar6 = pSVar7->nSrc;
        if (0 < iVar6) {
          lVar11 = 0;
          do {
            pSVar3 = pSVar7->a[lVar11].pSelect;
            if (pSVar3 != (Select *)0x0) {
              iVar6 = 0;
              for (aVar4 = pOuterNC; aVar4.pNC != (NameContext *)0x0;
                  aVar4 = (anon_union_8_11_9d6f43ba_for_u)(aVar4.pNC)->pNext) {
                iVar6 = iVar6 + (aVar4.pNC)->nRef;
              }
              pcVar10 = pParse->zAuthContext;
              pcVar5 = pSVar7->a[lVar11].zName;
              if (pcVar5 != (char *)0x0) {
                pParse->zAuthContext = pcVar5;
              }
              local_60.xExprCallback = resolveExprStep;
              local_60.xSelectCallback = resolveSelectStep;
              local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
              local_60.pParse = pParse;
              local_60.u = pOuterNC;
              sqlite3WalkSelect(&local_60,pSVar3);
              pParse->zAuthContext = pcVar10;
              if (pParse->nErr != 0) {
                return 2;
              }
              aVar4 = pOuterNC;
              if (psVar1->mallocFailed != '\0') {
                return 2;
              }
              for (; aVar4.pNC != (NameContext *)0x0; aVar4.pNC = (aVar4.pNC)->pNext) {
                iVar6 = iVar6 - (aVar4.pNC)->nRef;
              }
              pSVar7->a[lVar11].fg.field_0x1 =
                   pSVar7->a[lVar11].fg.field_0x1 & 0xf7 | (iVar6 != 0) << 3;
              pSVar7 = pSelect->pSrc;
              iVar6 = pSVar7->nSrc;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < iVar6);
        }
        local_98.ncFlags = 1;
        local_98.pSrcList = pSVar7;
        local_98.pNext = (NameContext *)pOuterNC;
        iVar6 = sqlite3ResolveExprListNames(&local_98,pSelect->pEList);
        if (iVar6 != 0) {
          return 2;
        }
        pOrderBy = pSelect->pGroupBy;
        if ((byte)((byte)((local_98.ncFlags & 0x10) >> 4) | pOrderBy != (ExprList *)0x0) == 1) {
          pSelect->selFlags = local_98.ncFlags & 0x1000 | pSelect->selFlags | 8;
        }
        else {
          local_98._48_8_ = local_98._48_8_ & 0xffffffffffffffee;
        }
        if (pSelect->pHaving != (Expr *)0x0 && pOrderBy == (ExprList *)0x0) {
          pcVar10 = "a GROUP BY clause is required before HAVING";
LAB_00236fd8:
          sqlite3ErrorMsg(pParse,pcVar10);
          return 2;
        }
        local_98.pEList = pSelect->pEList;
        iVar6 = sqlite3ResolveExprNames(&local_98,pSelect->pHaving);
        if (iVar6 != 0) {
          return 2;
        }
        iVar6 = sqlite3ResolveExprNames(&local_98,pSelect->pWhere);
        if (iVar6 != 0) {
          return 2;
        }
        pSVar7 = pSelect->pSrc;
        iVar6 = pSVar7->nSrc;
        if (0 < iVar6) {
          lVar11 = 0x68;
          lVar9 = 0;
          do {
            if ((*(byte *)((long)pSVar7->a + lVar11 + -0x2b) & 4) != 0) {
              iVar6 = sqlite3ResolveExprListNames
                                (&local_98,*(ExprList **)((long)pSVar7->a + lVar11 + -8));
              if (iVar6 != 0) {
                return 2;
              }
              pSVar7 = pSelect->pSrc;
              iVar6 = pSVar7->nSrc;
            }
            lVar9 = lVar9 + 1;
            lVar11 = lVar11 + 0x70;
          } while (lVar9 < iVar6);
        }
        local_98.pNext = (NameContext *)0x0;
        local_98._48_8_ = local_98._48_8_ | 1;
        if ((pSelect->selFlags & 0x10000) != 0) {
          pSVar3 = pSVar7->a[0].pSelect;
          pSelect->pOrderBy = pSVar3->pOrderBy;
          pSVar3->pOrderBy = (ExprList *)0x0;
        }
        if ((pSVar2 == (Select *)0x0 || iVar8 != 0) &&
           (iVar6 = resolveOrderGroupBy(&local_98,pSelect,pSelect->pOrderBy,"ORDER"), iVar6 != 0)) {
          return 2;
        }
        if (psVar1->mallocFailed != '\0') {
          return 2;
        }
        if (pOrderBy != (ExprList *)0x0) {
          iVar6 = resolveOrderGroupBy(&local_98,pSelect,pOrderBy,"GROUP");
          if (iVar6 != 0) {
            return 2;
          }
          if (psVar1->mallocFailed != '\0') {
            return 2;
          }
          iVar6 = pOrderBy->nExpr;
          if (0 < iVar6) {
            pEVar12 = pOrderBy->a;
            do {
              if ((pEVar12->pExpr->flags & 2) != 0) {
                pcVar10 = "aggregate functions are not allowed in the GROUP BY clause";
                goto LAB_00236fd8;
              }
              pEVar12 = pEVar12 + 1;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
        }
        pSVar3 = pSelect->pNext;
        if ((pSVar3 != (Select *)0x0) && (pSelect->pEList->nExpr != pSVar3->pEList->nExpr)) {
          sqlite3SelectWrongNumTermsError(pParse,pSVar3);
          return 2;
        }
        pSelect = pSelect->pPrior;
        iVar8 = iVar8 + 1;
      } while (pSelect != (Select *)0x0);
      iVar8 = 2;
      if ((pSVar2 == (Select *)0x0) || (iVar6 = resolveCompoundOrderBy(pParse,p), iVar6 == 0)) {
        iVar8 = 1;
      }
    }
  }
  return iVar8;
}

Assistant:

static int resolveSelectStep(Walker *pWalker, Select *p){
  NameContext *pOuterNC;  /* Context that contains this SELECT */
  NameContext sNC;        /* Name context of this SELECT */
  int isCompound;         /* True if p is a compound select */
  int nCompound;          /* Number of compound terms processed so far */
  Parse *pParse;          /* Parsing context */
  int i;                  /* Loop counter */
  ExprList *pGroupBy;     /* The GROUP BY clause */
  Select *pLeftmost;      /* Left-most of SELECT of a compound */
  sqlite3 *db;            /* Database connection */
  

  assert( p!=0 );
  if( p->selFlags & SF_Resolved ){
    return WRC_Prune;
  }
  pOuterNC = pWalker->u.pNC;
  pParse = pWalker->pParse;
  db = pParse->db;

  /* Normally sqlite3SelectExpand() will be called first and will have
  ** already expanded this SELECT.  However, if this is a subquery within
  ** an expression, sqlite3ResolveExprNames() will be called without a
  ** prior call to sqlite3SelectExpand().  When that happens, let
  ** sqlite3SelectPrep() do all of the processing for this SELECT.
  ** sqlite3SelectPrep() will invoke both sqlite3SelectExpand() and
  ** this routine in the correct order.
  */
  if( (p->selFlags & SF_Expanded)==0 ){
    sqlite3SelectPrep(pParse, p, pOuterNC);
    return (pParse->nErr || db->mallocFailed) ? WRC_Abort : WRC_Prune;
  }

  isCompound = p->pPrior!=0;
  nCompound = 0;
  pLeftmost = p;
  while( p ){
    assert( (p->selFlags & SF_Expanded)!=0 );
    assert( (p->selFlags & SF_Resolved)==0 );
    p->selFlags |= SF_Resolved;

    /* Resolve the expressions in the LIMIT and OFFSET clauses. These
    ** are not allowed to refer to any names, so pass an empty NameContext.
    */
    memset(&sNC, 0, sizeof(sNC));
    sNC.pParse = pParse;
    if( sqlite3ResolveExprNames(&sNC, p->pLimit) ||
        sqlite3ResolveExprNames(&sNC, p->pOffset) ){
      return WRC_Abort;
    }

    /* If the SF_Converted flags is set, then this Select object was
    ** was created by the convertCompoundSelectToSubquery() function.
    ** In this case the ORDER BY clause (p->pOrderBy) should be resolved
    ** as if it were part of the sub-query, not the parent. This block
    ** moves the pOrderBy down to the sub-query. It will be moved back
    ** after the names have been resolved.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      assert( p->pSrc->nSrc==1 && p->pOrderBy );
      assert( pSub->pPrior && pSub->pOrderBy==0 );
      pSub->pOrderBy = p->pOrderBy;
      p->pOrderBy = 0;
    }
  
    /* Recursively resolve names in all subqueries
    */
    for(i=0; i<p->pSrc->nSrc; i++){
      struct SrcList_item *pItem = &p->pSrc->a[i];
      if( pItem->pSelect ){
        NameContext *pNC;         /* Used to iterate name contexts */
        int nRef = 0;             /* Refcount for pOuterNC and outer contexts */
        const char *zSavedContext = pParse->zAuthContext;

        /* Count the total number of references to pOuterNC and all of its
        ** parent contexts. After resolving references to expressions in
        ** pItem->pSelect, check if this value has changed. If so, then
        ** SELECT statement pItem->pSelect must be correlated. Set the
        ** pItem->fg.isCorrelated flag if this is the case. */
        for(pNC=pOuterNC; pNC; pNC=pNC->pNext) nRef += pNC->nRef;

        if( pItem->zName ) pParse->zAuthContext = pItem->zName;
        sqlite3ResolveSelectNames(pParse, pItem->pSelect, pOuterNC);
        pParse->zAuthContext = zSavedContext;
        if( pParse->nErr || db->mallocFailed ) return WRC_Abort;

        for(pNC=pOuterNC; pNC; pNC=pNC->pNext) nRef -= pNC->nRef;
        assert( pItem->fg.isCorrelated==0 && nRef<=0 );
        pItem->fg.isCorrelated = (nRef!=0);
      }
    }
  
    /* Set up the local name-context to pass to sqlite3ResolveExprNames() to
    ** resolve the result-set expression list.
    */
    sNC.ncFlags = NC_AllowAgg;
    sNC.pSrcList = p->pSrc;
    sNC.pNext = pOuterNC;
  
    /* Resolve names in the result set. */
    if( sqlite3ResolveExprListNames(&sNC, p->pEList) ) return WRC_Abort;
  
    /* If there are no aggregate functions in the result-set, and no GROUP BY 
    ** expression, do not allow aggregates in any of the other expressions.
    */
    assert( (p->selFlags & SF_Aggregate)==0 );
    pGroupBy = p->pGroupBy;
    if( pGroupBy || (sNC.ncFlags & NC_HasAgg)!=0 ){
      assert( NC_MinMaxAgg==SF_MinMaxAgg );
      p->selFlags |= SF_Aggregate | (sNC.ncFlags&NC_MinMaxAgg);
    }else{
      sNC.ncFlags &= ~NC_AllowAgg;
    }
  
    /* If a HAVING clause is present, then there must be a GROUP BY clause.
    */
    if( p->pHaving && !pGroupBy ){
      sqlite3ErrorMsg(pParse, "a GROUP BY clause is required before HAVING");
      return WRC_Abort;
    }
  
    /* Add the output column list to the name-context before parsing the
    ** other expressions in the SELECT statement. This is so that
    ** expressions in the WHERE clause (etc.) can refer to expressions by
    ** aliases in the result set.
    **
    ** Minor point: If this is the case, then the expression will be
    ** re-evaluated for each reference to it.
    */
    sNC.pEList = p->pEList;
    if( sqlite3ResolveExprNames(&sNC, p->pHaving) ) return WRC_Abort;
    if( sqlite3ResolveExprNames(&sNC, p->pWhere) ) return WRC_Abort;

    /* Resolve names in table-valued-function arguments */
    for(i=0; i<p->pSrc->nSrc; i++){
      struct SrcList_item *pItem = &p->pSrc->a[i];
      if( pItem->fg.isTabFunc
       && sqlite3ResolveExprListNames(&sNC, pItem->u1.pFuncArg) 
      ){
        return WRC_Abort;
      }
    }

    /* The ORDER BY and GROUP BY clauses may not refer to terms in
    ** outer queries 
    */
    sNC.pNext = 0;
    sNC.ncFlags |= NC_AllowAgg;

    /* If this is a converted compound query, move the ORDER BY clause from 
    ** the sub-query back to the parent query. At this point each term
    ** within the ORDER BY clause has been transformed to an integer value.
    ** These integers will be replaced by copies of the corresponding result
    ** set expressions by the call to resolveOrderGroupBy() below.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      p->pOrderBy = pSub->pOrderBy;
      pSub->pOrderBy = 0;
    }

    /* Process the ORDER BY clause for singleton SELECT statements.
    ** The ORDER BY clause for compounds SELECT statements is handled
    ** below, after all of the result-sets for all of the elements of
    ** the compound have been resolved.
    **
    ** If there is an ORDER BY clause on a term of a compound-select other
    ** than the right-most term, then that is a syntax error.  But the error
    ** is not detected until much later, and so we need to go ahead and
    ** resolve those symbols on the incorrect ORDER BY for consistency.
    */
    if( isCompound<=nCompound  /* Defer right-most ORDER BY of a compound */
     && resolveOrderGroupBy(&sNC, p, p->pOrderBy, "ORDER")
    ){
      return WRC_Abort;
    }
    if( db->mallocFailed ){
      return WRC_Abort;
    }
  
    /* Resolve the GROUP BY clause.  At the same time, make sure 
    ** the GROUP BY clause does not contain aggregate functions.
    */
    if( pGroupBy ){
      struct ExprList_item *pItem;
    
      if( resolveOrderGroupBy(&sNC, p, pGroupBy, "GROUP") || db->mallocFailed ){
        return WRC_Abort;
      }
      for(i=0, pItem=pGroupBy->a; i<pGroupBy->nExpr; i++, pItem++){
        if( ExprHasProperty(pItem->pExpr, EP_Agg) ){
          sqlite3ErrorMsg(pParse, "aggregate functions are not allowed in "
              "the GROUP BY clause");
          return WRC_Abort;
        }
      }
    }

    /* If this is part of a compound SELECT, check that it has the right
    ** number of expressions in the select list. */
    if( p->pNext && p->pEList->nExpr!=p->pNext->pEList->nExpr ){
      sqlite3SelectWrongNumTermsError(pParse, p->pNext);
      return WRC_Abort;
    }

    /* Advance to the next term of the compound
    */
    p = p->pPrior;
    nCompound++;
  }

  /* Resolve the ORDER BY on a compound SELECT after all terms of
  ** the compound have been resolved.
  */
  if( isCompound && resolveCompoundOrderBy(pParse, pLeftmost) ){
    return WRC_Abort;
  }

  return WRC_Prune;
}